

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgList<char> * __thiscall
cimg_library::CImgList<char>::insert(CImgList<char> *this,CImg<char> *img,uint pos,bool is_shared)

{
  CImg<char> *pCVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ulong *puVar4;
  CImg<char> *pCVar5;
  CImgArgumentException *this_00;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  CImg<char> *pCVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar13 = this->_width;
  if (pos == 0xffffffff) {
    pos = uVar13;
  }
  uVar12 = (ulong)pos;
  if (uVar13 < pos) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"char",
               (ulong)img->_width,(ulong)img->_height,(ulong)img->_depth,(ulong)img->_spectrum,
               img->_data,uVar12);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  this->_width = uVar13 + 1;
  uVar6 = this->_allocated_width;
  if (uVar6 < uVar13 + 1) {
    uVar14 = 0x10;
    if (uVar6 != 0) {
      uVar14 = (ulong)(uVar6 * 2);
    }
    this->_allocated_width = (uint)uVar14;
    puVar4 = (ulong *)operator_new__(uVar14 * 0x20 + 8);
    *puVar4 = uVar14;
    if ((uint)uVar14 != 0) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar7 + 0x20) = 0;
        puVar2 = (undefined8 *)((long)puVar4 + lVar7 + 8);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined1 *)((long)puVar4 + lVar7 + 0x18) = 0;
        lVar7 = lVar7 + 0x20;
      } while (uVar14 * 0x20 != lVar7);
    }
    pCVar9 = (CImg<char> *)(puVar4 + 1);
    pCVar5 = this->_data;
    if (pCVar5 != (CImg<char> *)0x0) {
      if (pos != 0) {
        memcpy(pCVar9,pCVar5,uVar12 << 5);
      }
      if (uVar13 - pos != 0) {
        memcpy(pCVar9 + (ulong)pos + 1,pCVar5 + pos,(ulong)(uVar13 - pos) << 5);
      }
      pcVar8 = img->_data;
      if (is_shared) {
        if (pcVar8 != (char *)0x0) {
          uVar12 = (ulong)pos;
          uVar6 = img->_height;
          uVar10 = img->_depth;
          uVar11 = img->_spectrum;
          pCVar1 = pCVar9 + uVar12;
          pCVar1->_width = img->_width;
          pCVar1->_height = uVar6;
          pCVar1->_depth = uVar10;
          pCVar1->_spectrum = uVar11;
          *(undefined1 *)(puVar4 + uVar12 * 4 + 3) = 1;
          puVar4[uVar12 * 4 + 4] = (ulong)pcVar8;
          goto LAB_001a2b72;
        }
        pcVar8 = (char *)0x0;
      }
      uVar12 = (ulong)pos;
      puVar4[uVar12 * 4 + 4] = 0;
      pCVar5 = pCVar9 + uVar12;
      pCVar5->_width = 0;
      pCVar5->_height = 0;
      pCVar5->_depth = 0;
      pCVar5->_spectrum = 0;
      CImg<char>::assign(pCVar9 + uVar12,pcVar8,img->_width,img->_height,img->_depth,img->_spectrum)
      ;
      pCVar5 = this->_data;
      uVar13 = this->_width - 1;
LAB_001a2b72:
      memset(pCVar5,0,(ulong)uVar13 << 5);
      pCVar5 = this->_data;
      if (pCVar5 != (CImg<char> *)0x0) {
        if (pCVar5[-1]._data != (char *)0x0) {
          lVar7 = (long)pCVar5[-1]._data << 5;
          do {
            if ((*(char *)((long)pCVar5 + lVar7 + -0x10) == '\0') &&
               (pvVar3 = *(void **)((long)&pCVar5[-1]._data + lVar7), pvVar3 != (void *)0x0)) {
              operator_delete__(pvVar3);
            }
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pCVar5[-1]._data);
      }
      this->_data = pCVar9;
      return this;
    }
  }
  else {
    pCVar9 = this->_data;
    if (pCVar9 != (CImg<char> *)0x0) {
      if (uVar13 - pos != 0) {
        memmove(pCVar9 + uVar12 + 1,pCVar9 + uVar12,(ulong)(uVar13 - pos) << 5);
      }
      if (is_shared) {
        pcVar8 = img->_data;
        pCVar5 = this->_data;
        if (pcVar8 != (char *)0x0) {
          uVar13 = img->_height;
          uVar6 = img->_depth;
          uVar10 = img->_spectrum;
          pCVar9 = pCVar5 + uVar12;
          pCVar9->_width = img->_width;
          pCVar9->_height = uVar13;
          pCVar9->_depth = uVar6;
          pCVar9->_spectrum = uVar10;
          pCVar5[uVar12]._is_shared = true;
          pCVar5[uVar12]._data = pcVar8;
          return this;
        }
      }
      else {
        pCVar5 = this->_data;
      }
      pCVar9 = pCVar5 + uVar12;
      pCVar5[uVar12]._data = (char *)0x0;
      pCVar5 = pCVar5 + uVar12;
      pCVar5->_width = 0;
      pCVar5->_height = 0;
      pCVar5->_depth = 0;
      pCVar5->_spectrum = 0;
      pcVar8 = img->_data;
      uVar13 = img->_width;
      uVar6 = img->_height;
      uVar10 = img->_depth;
      uVar11 = img->_spectrum;
      goto LAB_001a2b2c;
    }
    pCVar9 = (CImg<char> *)0x0;
  }
  this->_data = pCVar9;
  pcVar8 = img->_data;
  if (is_shared) {
    if (pcVar8 != (char *)0x0) {
      uVar13 = img->_height;
      uVar6 = img->_depth;
      uVar10 = img->_spectrum;
      pCVar9->_width = img->_width;
      pCVar9->_height = uVar13;
      pCVar9->_depth = uVar6;
      pCVar9->_spectrum = uVar10;
      pCVar9->_is_shared = true;
      pCVar9->_data = pcVar8;
      return this;
    }
    pcVar8 = (char *)0x0;
  }
  uVar13 = img->_width;
  uVar6 = img->_height;
  uVar10 = img->_depth;
  uVar11 = img->_spectrum;
LAB_001a2b2c:
  CImg<char>::assign(pCVar9,pcVar8,uVar13,uVar6,uVar10,uVar11);
  return this;
}

Assistant:

CImgList<T>& insert(const CImg<T>& img, const unsigned int pos=~0U, const bool is_shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if (npos>_width)
        throw CImgArgumentException(_cimglist_instance
                                    "insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) "
                                    "at position %u.",
                                    cimglist_instance,
                                    img._width,img._height,img._depth,img._spectrum,img._data,npos);
      CImg<T> *const new_data = (++_width>_allocated_width)?new CImg<T>[_allocated_width?(_allocated_width<<=1):
                                                                        (_allocated_width=16)]:0;
      if (!_data) { // Insert new element into empty list
        _data = new_data;
        if (is_shared && img) {
          _data->_width = img._width;
          _data->_height = img._height;
          _data->_depth = img._depth;
          _data->_spectrum = img._spectrum;
          _data->_is_shared = true;
          _data->_data = img._data;
        } else *_data = img;
      }
      else {
        if (new_data) { // Insert with re-allocation
          if (npos) std::memcpy((void*)new_data,(void*)_data,sizeof(CImg<T>)*npos);
          if (npos!=_width - 1)
            std::memcpy((void*)(new_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            new_data[npos]._width = img._width;
            new_data[npos]._height = img._height;
            new_data[npos]._depth = img._depth;
            new_data[npos]._spectrum = img._spectrum;
            new_data[npos]._is_shared = true;
            new_data[npos]._data = img._data;
          } else {
            new_data[npos]._width = new_data[npos]._height = new_data[npos]._depth = new_data[npos]._spectrum = 0;
            new_data[npos]._data = 0;
            new_data[npos] = img;
          }
          std::memset((void*)_data,0,sizeof(CImg<T>)*(_width - 1));
          delete[] _data;
          _data = new_data;
        } else { // Insert without re-allocation
          if (npos!=_width - 1)
            std::memmove((void*)(_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            _data[npos]._width = img._width;
            _data[npos]._height = img._height;
            _data[npos]._depth = img._depth;
            _data[npos]._spectrum = img._spectrum;
            _data[npos]._is_shared = true;
            _data[npos]._data = img._data;
          } else {
            _data[npos]._width = _data[npos]._height = _data[npos]._depth = _data[npos]._spectrum = 0;
            _data[npos]._data = 0;
            _data[npos] = img;
          }
        }
      }
      return *this;
    }